

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O2

bool __thiscall
FWeaponSlots::LocateWeapon(FWeaponSlots *this,PClassWeapon *type,int *slot,int *index)

{
  int iVar1;
  int i;
  ulong uVar2;
  
  uVar2 = 0;
  do {
    if (uVar2 == 10) {
LAB_004a30f7:
      return uVar2 < 10;
    }
    iVar1 = FWeaponSlot::LocateWeapon(this->Slots,type);
    if (-1 < iVar1) {
      if (slot != (int *)0x0) {
        *slot = (int)uVar2;
      }
      if (index != (int *)0x0) {
        *index = iVar1;
      }
      goto LAB_004a30f7;
    }
    uVar2 = uVar2 + 1;
    this = (FWeaponSlots *)((long)this + 0x10);
  } while( true );
}

Assistant:

bool FWeaponSlots::LocateWeapon (PClassWeapon *type, int *const slot, int *const index)
{
	int i, j;

	for (i = 0; i < NUM_WEAPON_SLOTS; i++)
	{
		j = Slots[i].LocateWeapon(type);
		if (j >= 0)
		{
			if (slot != NULL) *slot = i;
			if (index != NULL) *index = j;
			return true;
		}
	}
	return false;
}